

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_barrierback_(lua_State *L,GCObject *o)

{
  global_State *pgVar1;
  GCObject **pnext;
  global_State *g;
  GCObject *o_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if ((o->marked & 7) == 6) {
    o->marked = o->marked & 199;
  }
  else {
    pnext = getgclist(o);
    linkgclist_(o,pnext,&pgVar1->grayagain);
  }
  if (1 < (o->marked & 7)) {
    o->marked = o->marked & 0xf8 | 5;
  }
  return;
}

Assistant:

void luaC_barrierback_ (lua_State *L, GCObject *o) {
  global_State *g = G(L);
  lua_assert(isblack(o) && !isdead(g, o));
  lua_assert((g->gckind == KGC_GEN) == (isold(o) && getage(o) != G_TOUCHED1));
  if (getage(o) == G_TOUCHED2)  /* already in gray list? */
    set2gray(o);  /* make it gray to become touched1 */
  else  /* link it in 'grayagain' and paint it gray */
    linkobjgclist(o, g->grayagain);
  if (isold(o))  /* generational mode? */
    setage(o, G_TOUCHED1);  /* touched in current cycle */
}